

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendCo(Gia_Man_t *p,int iLit0)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pFanout;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (iLit0 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit0 >> 1;
  if ((int)uVar4 < p->nObjs) {
    if ((~*(uint *)(p->pObjs + uVar4) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar4) < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pFanout = Gia_ManAppendObj(p);
    uVar1 = *(ulong *)pFanout;
    *(ulong *)pFanout = uVar1 | 0x80000000;
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
      uVar3 = (ulong)(((uint)((int)pFanout - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
      uVar5 = (ulong)((iLit0 & 1U) << 0x1d);
      *(ulong *)pFanout = uVar5 | uVar1 & 0xffffffffc0000000 | 0x80000000 | uVar3;
      *(ulong *)pFanout =
           uVar5 | uVar1 & 0xe0000000c0000000 | 0x80000000 | uVar3 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
        Vec_IntPush(p->vCos,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),pFanout);
        }
        pGVar2 = p->pObjs;
        if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
          return (int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * 0x55555556;
        }
      }
    }
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendCo( Gia_Man_t * p, int iLit0 )  
{ 
    Gia_Obj_t * pObj;
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( !Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0))) );
    pObj = Gia_ManAppendObj( p );    
    pObj->fTerm = 1;
    pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
    pObj->fCompl0 = Abc_LitIsCompl(iLit0);
    pObj->iDiff1  = Vec_IntSize( p->vCos );
    Vec_IntPush( p->vCos, Gia_ObjId(p, pObj) );
    if ( p->pFanData )
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
    return Gia_ObjId( p, pObj ) << 1;
}